

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O2

void __thiscall ON_DimStyle::SetFont(ON_DimStyle *this,ON_Font *font_characteristics)

{
  bool bVar1;
  int iVar2;
  ON_Font *pOVar3;
  undefined1 auStack_38 [16];
  
  pOVar3 = ON_Font::ManagedFont(font_characteristics);
  if (pOVar3 == (ON_Font *)0x0) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_dimensionstyle.cpp"
               ,0xda7,"","ON_Font::GetManagedFont(font_characteristics) failed.");
    return;
  }
  if (this->m_managed_font == pOVar3) {
    iVar2 = ON_Font::CompareFontCharacteristics(font_characteristics,&this->m_font_characteristics);
    if (iVar2 != 0) goto LAB_00471b1f;
    ON_Font::Description((ON_Font *)(auStack_38 + 8));
    ON_Font::Description((ON_Font *)auStack_38);
    bVar1 = ::operator!=((ON_wString *)(auStack_38 + 8),(ON_wString *)auStack_38);
    ON_wString::~ON_wString((ON_wString *)auStack_38);
    ON_wString::~ON_wString((ON_wString *)(auStack_38 + 8));
    ON_Font::operator=(&this->m_font_characteristics,font_characteristics);
    if (!bVar1) goto LAB_00471b3d;
  }
  else {
LAB_00471b1f:
    ON_Font::operator=(&this->m_font_characteristics,font_characteristics);
  }
  this->m_managed_font = pOVar3;
  Internal_TextPositionPropertiesChange(this);
LAB_00471b3d:
  Internal_SetOverrideDimStyleCandidateFieldOverride(this,Font);
  return;
}

Assistant:

void ON_DimStyle::SetFont(
  const ON_Font& font_characteristics
)
{
  const ON_Font* managed_font = font_characteristics.ManagedFont();
  if (nullptr == managed_font)
  {
    ON_ERROR("ON_Font::GetManagedFont(font_characteristics) failed.");
    return;
  }

  const bool bManagedFontChanged = (m_managed_font != managed_font);

  const bool bFontChanged
    = bManagedFontChanged
    || (0 != ON_Font::CompareFontCharacteristics(font_characteristics, m_font_characteristics))
    || m_font_characteristics.Description() != font_characteristics.Description()
    ;

  // copy font_characteristics unconditionally in case compare missed some detail.
  m_font_characteristics = font_characteristics;

  if (bFontChanged)
  {
    m_managed_font = managed_font;
    Internal_TextPositionPropertiesChange();
  }

  Internal_SetOverrideDimStyleCandidateFieldOverride(ON_DimStyle::field::Font);
}